

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLFunctionLoader.cpp
# Opt level: O0

FunctionLibrary * __thiscall eglu::GLLibraryCache::getLibrary(GLLibraryCache *this,ApiType apiType)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppVar3;
  pair<unsigned_int,_tcu::FunctionLibrary_*> pVar4;
  pair<unsigned_int,_tcu::FunctionLibrary_*> local_50;
  uint local_3c;
  _Self local_38;
  _Self local_30;
  iterator iter;
  FunctionLibrary *pFStack_20;
  deUint32 key;
  FunctionLibrary *library;
  GLLibraryCache *this_local;
  ApiType apiType_local;
  
  pFStack_20 = (FunctionLibrary *)0x0;
  library = (FunctionLibrary *)this;
  this_local._4_4_ = apiType.m_bits;
  iter._M_node._4_4_ = glu::ApiType::getPacked((ApiType *)((long)&this_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_tcu::FunctionLibrary_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
       ::find(&this->m_libraries,(key_type_conflict *)((long)&iter._M_node + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_tcu::FunctionLibrary_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
       ::end(&this->m_libraries);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    local_3c = this_local._4_4_;
    iVar2 = (*this->m_platform->_vptr_Platform[2])
                      (this->m_platform,(ulong)this_local._4_4_,this->m_cmdLine);
    pFStack_20 = (FunctionLibrary *)CONCAT44(extraout_var,iVar2);
    pVar4 = std::make_pair<unsigned_int_const&,tcu::FunctionLibrary*&>
                      ((uint *)((long)&iter._M_node + 4),&stack0xffffffffffffffe0);
    local_50.second = pVar4.second;
    local_50.first = pVar4.first;
    std::
    map<unsigned_int,tcu::FunctionLibrary*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
    ::insert<std::pair<unsigned_int,tcu::FunctionLibrary*>>
              ((map<unsigned_int,tcu::FunctionLibrary*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
                *)&this->m_libraries,&local_50);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>::
             operator->(&local_30);
    pFStack_20 = ppVar3->second;
  }
  return pFStack_20;
}

Assistant:

const tcu::FunctionLibrary* GLLibraryCache::getLibrary (glu::ApiType apiType)
{
	tcu::FunctionLibrary*	library	= DE_NULL;
	const deUint32			key		= apiType.getPacked();
	LibraryMap::iterator	iter	= m_libraries.find(key);

	if (iter == m_libraries.end())
	{
		library = m_platform.createDefaultGLFunctionLibrary(apiType, m_cmdLine);
		try
		{
			m_libraries.insert(std::make_pair(key, library));
		}
		catch (...)
		{
			delete library;
			throw;
		}
	}
	else
		library = iter->second;

	return library;
}